

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

AddrOpnd * IR::AddrOpnd::NewFromNumberVar(double value,Func *func,bool dontEncode)

{
  bool bVar1;
  Var address;
  AddrOpnd *this;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  AddrOpnd *addrOpnd;
  Var var;
  bool dontEncode_local;
  Func *func_local;
  double value_local;
  
  address = Func::AllocateNumber(func,value);
  this = New((intptr_t)address,AddrOpndKindDynamicVar,func,dontEncode,(Var)0x0);
  bVar1 = Js::JavascriptNumber::IsInt32(value);
  if (bVar1) {
    local_32.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
  }
  else {
    local_32 = ValueType::Float.field_0;
  }
  (this->super_Opnd).m_valueType.field_0.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_32;
  Opnd::SetValueTypeFixed(&this->super_Opnd);
  return this;
}

Assistant:

AddrOpnd *
AddrOpnd::NewFromNumberVar(double value, Func *func, bool dontEncode /* = false */)
{
    Js::Var var = func->AllocateNumber((double)value);
    AddrOpnd* addrOpnd = New((intptr_t)var, AddrOpndKindDynamicVar, func, dontEncode);
    addrOpnd->m_valueType =
        Js::JavascriptNumber::IsInt32(value)
        ? ValueType::GetInt(false)
        : ValueType::Float;
    addrOpnd->SetValueTypeFixed();

    return addrOpnd;
}